

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

QMimeData * __thiscall
QSortFilterProxyModel::mimeData(QSortFilterProxyModel *this,QModelIndexList *indexes)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  QModelIndex *idx;
  QModelIndex *pQVar5;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QModelIndex *)0x0;
  local_58.size = 0;
  QList<QModelIndex>::reserve((QList<QModelIndex> *)&local_58,(indexes->d).size);
  pQVar5 = (indexes->d).ptr;
  for (lVar4 = (indexes->d).size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    (**(code **)(*(long *)this + 400))(&local_70,this,pQVar5);
    QList<QModelIndex>::emplaceBack<QModelIndex>((QList<QModelIndex> *)&local_58,&local_70);
    pQVar5 = pQVar5 + 1;
  }
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           *)(lVar1 + 0xd8));
  pQVar2 = (((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              *)(lVar1 + 0xd8))->super_QPropertyData<QAbstractItemModel_*>).val;
  iVar3 = (*(pQVar2->super_QObject)._vptr_QObject[0x1a])(pQVar2,&local_58);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMimeData *)CONCAT44(extraout_var,iVar3);
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QSortFilterProxyModel::mimeData(const QModelIndexList &indexes) const
{
    Q_D(const QSortFilterProxyModel);
    QModelIndexList source_indexes;
    source_indexes.reserve(indexes.size());
    for (const QModelIndex &idx : indexes)
        source_indexes << mapToSource(idx);
    return d->model->mimeData(source_indexes);
}